

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O2

void glmc_rotated(vec4 *m,float angle,float *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar3 = cosf(angle);
  fVar4 = axis[2];
  fVar17 = 1.0 - fVar3;
  fVar8 = (float)*(undefined8 *)axis;
  fVar10 = (float)((ulong)*(undefined8 *)axis >> 0x20);
  fVar11 = SQRT(fVar4 * fVar4 + fVar8 * fVar8 + fVar10 * fVar10);
  fVar5 = 1.0 / fVar11;
  fVar8 = (float)(~((int)((uint)(fVar11 < 1.1920929e-07) << 0x1f) >> 0x1f) & (uint)(fVar5 * fVar8));
  fVar10 = (float)(~((int)((uint)(fVar11 < 1.1920929e-07) << 0x1f) >> 0x1f) & (uint)(fVar5 * fVar10)
                  );
  fVar6 = 0.0;
  if (1.1920929e-07 <= fVar11) {
    fVar6 = fVar5 * fVar4;
  }
  fVar11 = fVar17 * fVar10;
  fVar5 = fVar17 * fVar6;
  fVar4 = sinf(angle);
  fVar17 = fVar17 * fVar8;
  fVar12 = fVar8 * fVar11 - fVar6 * fVar4;
  fVar7 = fVar8 * fVar5 + fVar4 * fVar10;
  fVar13 = fVar3 + fVar17 * fVar8;
  fVar14 = fVar6 * fVar4 + fVar17 * fVar10;
  fVar9 = fVar17 * fVar6 - fVar4 * fVar10;
  fVar18 = fVar10 * fVar5 - fVar4 * fVar8;
  fVar15 = fVar6 * fVar11 + fVar4 * fVar8;
  fVar16 = fVar3 + fVar11 * fVar10;
  fVar3 = fVar5 * fVar6 + fVar3;
  fVar4 = (*m)[0];
  fVar8 = (*m)[1];
  fVar10 = (*m)[2];
  fVar5 = m[1][0];
  fVar6 = m[1][1];
  fVar17 = m[1][2];
  fVar11 = m[2][0];
  fVar1 = m[2][1];
  fVar2 = m[2][2];
  (*m)[0] = fVar10 * fVar7 + fVar8 * fVar12 + fVar4 * fVar13;
  (*m)[1] = fVar10 * fVar18 + fVar8 * fVar16 + fVar4 * fVar14;
  (*m)[2] = fVar10 * fVar3 + fVar8 * fVar15 + fVar4 * fVar9;
  (*m)[3] = fVar10 * 0.0 + fVar8 * 0.0 + fVar4 * 0.0;
  m[1][0] = fVar17 * fVar7 + fVar6 * fVar12 + fVar5 * fVar13;
  m[1][1] = fVar17 * fVar18 + fVar6 * fVar16 + fVar5 * fVar14;
  m[1][2] = fVar17 * fVar3 + fVar6 * fVar15 + fVar5 * fVar9;
  m[1][3] = fVar17 * 0.0 + fVar6 * 0.0 + fVar5 * 0.0;
  m[2][0] = fVar2 * fVar7 + fVar1 * fVar12 + fVar11 * fVar13;
  m[2][1] = fVar2 * fVar18 + fVar1 * fVar16 + fVar11 * fVar14;
  m[2][2] = fVar2 * fVar3 + fVar1 * fVar15 + fVar11 * fVar9;
  m[2][3] = fVar2 * 0.0 + fVar1 * 0.0 + fVar11 * 0.0;
  *(float *)((long)(m + 3) + 0) = 0.0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  *(float *)((long)(m + 3) + 0xc) = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotated(mat4 m, float angle, vec3 axis) {
  glm_rotated(m, angle, axis);
}